

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
          (QPDFEmbeddedFileDocumentHelper *this,QPDF *qpdf)

{
  bool bVar1;
  Members *this_00;
  element_type *this_01;
  QPDFObjectHandle local_b8;
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  QPDFObjectHandle embedded_files;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle names;
  QPDFObjectHandle root;
  QPDF *qpdf_local;
  QPDFEmbeddedFileDocumentHelper *this_local;
  
  QPDFDocumentHelper::QPDFDocumentHelper(&this->super_QPDFDocumentHelper,qpdf);
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFEmbeddedFileDocumentHelper_0058c3f8;
  this_00 = (Members *)operator_new(0x10);
  (this_00->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this_00->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Members::Members(this_00);
  std::shared_ptr<QPDFEmbeddedFileDocumentHelper::Members>::
  shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,void>(&this->m,this_00);
  QPDF::getRoot((QPDF *)&names.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"/Names",
             (allocator<char> *)
             ((long)&embedded_files.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_48,
             (string *)
             &names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&embedded_files.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_48);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/EmbeddedFiles",&local_a1);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_80,(string *)local_48);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_80);
    if (bVar1) {
      std::make_shared<QPDFNameTreeObjectHelper,QPDFObjectHandle&,QPDF&>(&local_b8,(QPDF *)local_80)
      ;
      this_01 = std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m);
      std::shared_ptr<QPDFNameTreeObjectHelper>::operator=
                (&this_01->embedded_files,(shared_ptr<QPDFNameTreeObjectHelper> *)&local_b8);
      std::shared_ptr<QPDFNameTreeObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFNameTreeObjectHelper> *)&local_b8);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    auto root = qpdf.getRoot();
    auto names = root.getKey("/Names");
    if (names.isDictionary()) {
        auto embedded_files = names.getKey("/EmbeddedFiles");
        if (embedded_files.isDictionary()) {
            m->embedded_files = std::make_shared<QPDFNameTreeObjectHelper>(embedded_files, qpdf);
        }
    }
}